

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

logic_t __thiscall slang::SVInt::operator[](SVInt *this,int32_t index)

{
  uint64_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  uint in_ESI;
  SVInt *in_RDI;
  bool unknownBit;
  bool bit;
  bitwidth_t bi;
  uint8_t *local_60;
  ulong local_38;
  logic_t local_1;
  
  if (((int)in_ESI < 0) || ((in_RDI->super_SVIntStorage).bitWidth <= in_ESI)) {
    local_1.value = 0x80;
  }
  else {
    uVar5 = maskBit(0);
    bVar2 = isSingleWord(in_RDI);
    if (bVar2) {
      local_38 = (in_RDI->super_SVIntStorage).field_0.val;
    }
    else {
      puVar1 = (in_RDI->super_SVIntStorage).field_0.pVal;
      uVar3 = whichWord(in_ESI);
      local_38 = puVar1[uVar3];
    }
    bVar2 = (uVar5 & local_38) != 0;
    if (((in_RDI->super_SVIntStorage).unknownFlag & 1U) == 0) {
      logic_t::logic_t(&local_1,bVar2);
    }
    else {
      uVar5 = maskBit(0);
      puVar1 = (in_RDI->super_SVIntStorage).field_0.pVal;
      uVar3 = whichWord(in_ESI);
      uVar4 = getNumWords((in_RDI->super_SVIntStorage).bitWidth,false);
      if ((uVar5 & puVar1[uVar3 + uVar4]) == 0) {
        logic_t::logic_t(&local_1,bVar2);
      }
      else {
        if (bVar2) {
          local_60 = "@";
        }
        else {
          local_60 = &logic_t::x;
        }
        local_1.value = *local_60;
      }
    }
  }
  return (logic_t)local_1.value;
}

Assistant:

logic_t SVInt::operator[](int32_t index) const {
    bitwidth_t bi = bitwidth_t(index);
    if (index < 0 || bi >= bitWidth)
        return logic_t::x;

    bool bit = (maskBit(bi) & (isSingleWord() ? val : pVal[whichWord(bi)])) != 0;
    if (!unknownFlag)
        return logic_t(bit);

    bool unknownBit = (maskBit(bi) & pVal[whichWord(bi) + getNumWords(bitWidth, false)]) != 0;
    if (!unknownBit)
        return logic_t(bit);

    return bit ? logic_t::z : logic_t::x;
}